

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O0

charcount_t Js::JSONStringifier::CalculateStringElementLength(JavascriptString *str)

{
  char16 ch;
  charcount_t cVar1;
  BOOL BVar2;
  char16 *pcVar3;
  char16 *pcStack_30;
  char16 currentCharacter;
  char16 *index;
  char16 *bufferStart;
  uint64 escapedStrLength;
  charcount_t strLength;
  JavascriptString *str_local;
  
  cVar1 = JavascriptString::GetLength(str);
  bufferStart = (char16 *)(ulong)(cVar1 + 2);
  pcVar3 = JavascriptString::GetString(str);
  for (pcStack_30 = JavascriptString::GetString(str); pcStack_30 < pcVar3 + cVar1;
      pcStack_30 = pcStack_30 + 1) {
    ch = *pcStack_30;
    if ((ushort)ch < 0x80) {
      bufferStart = (char16 *)
                    ((ulong)(byte)LazyJSONString::escapeMapCount[(ushort)ch] + (long)bufferStart);
    }
    else {
      BVar2 = utf8::IsLowSurrogateChar(ch);
      if (BVar2 == 0) {
        BVar2 = utf8::IsHighSurrogateChar(ch);
        if (BVar2 != 0) {
          if ((pcStack_30 + 1 < pcVar3 + cVar1) &&
             (BVar2 = utf8::IsLowSurrogateChar(pcStack_30[1]), BVar2 != 0)) {
            pcStack_30 = pcStack_30 + 1;
          }
          else {
            bufferStart = (char16 *)((long)bufferStart + 5);
          }
        }
      }
      else {
        bufferStart = (char16 *)((long)bufferStart + 5);
      }
    }
  }
  if (bufferStart < (char16 *)0x100000000) {
    return (charcount_t)bufferStart;
  }
  Throw::OutOfMemory();
}

Assistant:

charcount_t
JSONStringifier::CalculateStringElementLength(_In_ JavascriptString* str)
{
    const charcount_t strLength = str->GetLength();

    // To avoid overflow checks, use uint64 for intermediate size calculation. We cannot overflow uint64,
    // as stringification will be at most a 5x expansion of the original string (which has max length INT_MAX - 1)
    //
    // All JSON strings are enclosed in double quotes, so add 2 to the length to account for them
    uint64 escapedStrLength = strLength + 2;
    const char16* bufferStart = str->GetString();
    for (const char16* index = str->GetString(); index < bufferStart + strLength; ++index)
    {
        char16 currentCharacter = *index;

        // Some characters may require an escape sequence. We can use the escapeMapCount table
        // to determine how many extra characters are needed
        if (currentCharacter < _countof(LazyJSONString::escapeMapCount))
        {
            escapedStrLength += LazyJSONString::escapeMapCount[currentCharacter];
        }
        else if (utf8::IsLowSurrogateChar(currentCharacter))
        {
            // Lone trailing-surrogate code units should be escaped.
            // They will always need 5 extra characters for the escape sequence, ie: \udbff
            escapedStrLength += 5;
        }
        else if (utf8::IsHighSurrogateChar(currentCharacter))
        {
            if (index + 1 < bufferStart + strLength && utf8::IsLowSurrogateChar(*(index + 1)))
            {
                // Regular surrogate pairs are handled normally - skip the trailing-surrogate code unit.
                index++;
            }
            else
            {
                // High-surrogate code unit not followed by a trailing-surrogate code unit should be escaped.
                escapedStrLength += 5;
            }
        }
    }
    if (escapedStrLength > UINT32_MAX)
    {
        Js::Throw::OutOfMemory();
    }
    return static_cast<charcount_t>(escapedStrLength);
}